

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrmpack.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  undefined8 *puVar2;
  char *pcVar3;
  long lVar4;
  Mesh *pMVar5;
  uint *puVar6;
  _func_void_ptr_void_ptr_cgltf_size *p_Var7;
  pointer puVar8;
  cgltf_buffer_view *pcVar9;
  size_t __n;
  cgltf_buffer *pcVar10;
  double dVar11;
  ulong target_index_count;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  FILE *__stream;
  undefined8 uVar14;
  cgltf_data *data_00;
  int iVar15;
  cgltf_result cVar16;
  int iVar17;
  uint32_t uVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cgltf_size cVar19;
  ulong uVar20;
  ostream *poVar21;
  size_t sVar22;
  void *pvVar23;
  _Rb_tree_node_base *p_Var24;
  long lVar25;
  size_t sVar26;
  cgltf_size i;
  cgltf_size cVar27;
  cgltf_size index;
  char *pcVar28;
  long lVar29;
  cgltf_primitive *pcVar30;
  size_type sVar31;
  int iVar32;
  cgltf_accessor *acc_POSITION;
  cgltf_accessor *pcVar33;
  size_t i_2;
  cgltf_mesh *pcVar34;
  bool bVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Dd_00;
  char *local_c78;
  allocator local_c69;
  undefined1 local_c68 [16];
  undefined1 local_c58 [16];
  double local_c40;
  _Rb_tree_node_base *local_c38;
  int local_c30;
  uint32_t json_size;
  vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> meshes;
  _Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> local_c10;
  vector<const_char_*,_std::allocator<const_char_*>_> testinputs;
  string out_bin;
  string out_json;
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  _Ios_Openmode local_b38 [8];
  cgltf_options write_options;
  cgltf_options options;
  ofstream out_st;
  cgltf_data *data;
  streambuf local_6c0 [504];
  stringstream outss_bin;
  ostream local_4b8 [376];
  stringstream outss_json;
  ostream local_330 [376];
  stringstream inss_json;
  ostream local_1a8 [376];
  
  testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c40 = (double)CONCAT44(local_c40._4_4_,0x3f800000);
  local_c38 = (_Rb_tree_node_base *)0x0;
  iVar17 = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_c68._0_8_;
  local_c68 = auVar12 << 0x40;
  local_c78 = (char *)0x0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_c58._0_8_;
  local_c58 = auVar13 << 0x40;
  for (iVar32 = 1; auVar12 = local_c58, __stream = _stderr, iVar32 < argc; iVar32 = iVar32 + 1) {
    pcVar28 = argv[iVar32];
    iVar15 = strcmp(pcVar28,"-si");
    if (((iVar15 == 0) && (iVar15 = iVar32 + 1, iVar15 < argc)) && ((int)*argv[iVar15] - 0x30U < 10)
       ) {
      dVar11 = atof(argv[iVar15]);
      local_c40 = (double)CONCAT44(local_c40._4_4_,(float)dVar11);
      iVar32 = iVar15;
    }
    else {
      iVar15 = strcmp(pcVar28,"-sa");
      if (iVar15 == 0) {
        local_c38 = (_Rb_tree_node_base *)CONCAT71((int7)(CONCAT44(extraout_var,iVar15) >> 8),1);
      }
      else {
        cVar1 = *pcVar28;
        if (cVar1 == '-') {
          if (((pcVar28[1] == 'i') && (pcVar28[2] == '\0')) &&
             ((iVar32 + 1 < argc && (local_c68._0_8_ == 0)))) {
            local_c68._0_8_ = argv[iVar32 + 1];
          }
          else {
            if (((pcVar28[1] != 'o') || (pcVar28[2] != '\0')) ||
               ((argc <= iVar32 + 1 || (local_c78 != (char *)0x0)))) {
              if ((pcVar28[1] == 'v') && (pcVar28[2] == '\0')) {
                iVar17 = 1;
                goto LAB_0010c735;
              }
              goto LAB_0010c6ee;
            }
            local_c78 = argv[iVar32 + 1];
          }
          iVar32 = iVar32 + 1;
        }
        else {
LAB_0010c6ee:
          iVar15 = strcmp(pcVar28,"-vv");
          auVar12 = local_c58;
          if (iVar15 == 0) {
            iVar17 = 2;
          }
          else if (cVar1 == '-') {
            if (pcVar28[1] == 'h') {
              local_c58._1_7_ = (int7)(CONCAT44(extraout_var_00,iVar15) >> 8);
              local_c58[0] = 1;
              local_c58._8_8_ = auVar12._8_8_;
              if (pcVar28[2] == '\0') goto LAB_0010c735;
            }
            fprintf(_stderr,"Unrecognized option %s\n",pcVar28);
            goto LAB_0010d374;
          }
        }
      }
    }
LAB_0010c735:
  }
  if (argc == 2 && iVar17 != 0) {
    getVersion_abi_cxx11_();
    iVar17 = 0;
    printf("vrmpack %s\n",options._0_8_);
    std::__cxx11::string::~string((string *)&options);
    goto LAB_0010d1c4;
  }
  if ((((char *)local_c68._0_8_ == (char *)0x0) || (local_c78 == (char *)0x0)) ||
     ((local_c58 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    getVersion_abi_cxx11_();
    fprintf(__stream,"vrmpack %s\n",options._0_8_);
    std::__cxx11::string::~string((string *)&options);
    fwrite("Usage: vrmpack [options] -i input -o output\n",0x2c,1,_stderr);
    fwrite("\nBasics:\n",9,1,_stderr);
    fwrite("\t-i file: input file to process, .vrm\n",0x26,1,_stderr);
    fwrite("\t-o file: output file path, .vrm\n",0x21,1,_stderr);
    if ((auVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fwrite("\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n"
             ,0x59,1,_stderr);
      pcVar28 = "\nRun vrmpack -h to display a full list of options\n";
      sVar26 = 0x32;
    }
    else {
      fwrite("\nSimplification:\n",0x11,1,_stderr);
      fwrite("\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n"
             ,0x59,1,_stderr);
      fwrite("\t-sa: aggressively simplify to the target ratio disregarding quality\n",0x45,1,
             _stderr);
      fwrite("\nMiscellaneous:\n",0x10,1,_stderr);
      fwrite("\t-v: verbose output (print version when used without other options)\n",0x44,1,_stderr
            );
      pcVar28 = "\t-h: display this help and exit\n";
      sVar26 = 0x20;
    }
    fwrite(pcVar28,sVar26,1,_stderr);
LAB_0010d374:
    iVar17 = 1;
    goto LAB_0010d1c4;
  }
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.file.release = (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
  options.file.user_data = (void *)0x0;
  options.memory.user_data = (void *)0x0;
  options.file.read =
       (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
        *)0x0;
  options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
  options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
  options.type = cgltf_file_type_invalid;
  options._4_4_ = 0;
  options.json_token_count = 0;
  data = (cgltf_data *)0x0;
  cVar16 = cgltf_parse_file(&options,(char *)local_c68._0_8_,&data);
  data_00 = data;
  if (cVar16 == cgltf_result_success) {
    cVar16 = cgltf_load_buffers(&options,data,(char *)local_c68._0_8_);
    if (cVar16 != cgltf_result_success) {
      cgltf_free(data_00);
      pcVar28 = "Failed to load buffers from %s\n";
      goto LAB_0010d33b;
    }
    uVar20 = 0;
    while (uVar20 < data_00->meshes_count) {
      local_c68._0_8_ = uVar20;
      pcVar34 = data_00->meshes + uVar20;
      uVar20 = 0;
      while (uVar20 < pcVar34->primitives_count) {
        local_c58._0_8_ = uVar20;
        pcVar30 = pcVar34->primitives + uVar20;
        _out_st = (char *)operator_new(0x88);
        _out_st[0x50] = '\0';
        _out_st[0x51] = '\0';
        _out_st[0x52] = '\0';
        _out_st[0x53] = '\0';
        _out_st[0x54] = '\0';
        _out_st[0x55] = '\0';
        _out_st[0x56] = '\0';
        _out_st[0x57] = '\0';
        _out_st[0x58] = '\0';
        _out_st[0x59] = '\0';
        _out_st[0x5a] = '\0';
        _out_st[0x5b] = '\0';
        _out_st[0x5c] = '\0';
        _out_st[0x5d] = '\0';
        _out_st[0x5e] = '\0';
        _out_st[0x5f] = '\0';
        _out_st[0x60] = '\0';
        _out_st[0x61] = '\0';
        _out_st[0x62] = '\0';
        _out_st[99] = '\0';
        _out_st[100] = '\0';
        _out_st[0x65] = '\0';
        _out_st[0x66] = '\0';
        _out_st[0x67] = '\0';
        _out_st[0x68] = '\0';
        _out_st[0x69] = '\0';
        _out_st[0x6a] = '\0';
        _out_st[0x6b] = '\0';
        _out_st[0x6c] = '\0';
        _out_st[0x6d] = '\0';
        _out_st[0x6e] = '\0';
        _out_st[0x6f] = '\0';
        _out_st[0x30] = '\0';
        _out_st[0x31] = '\0';
        _out_st[0x32] = '\0';
        _out_st[0x33] = '\0';
        _out_st[0x34] = '\0';
        _out_st[0x35] = '\0';
        _out_st[0x36] = '\0';
        _out_st[0x37] = '\0';
        _out_st[0x38] = '\0';
        _out_st[0x39] = '\0';
        _out_st[0x3a] = '\0';
        _out_st[0x3b] = '\0';
        _out_st[0x3c] = '\0';
        _out_st[0x3d] = '\0';
        _out_st[0x3e] = '\0';
        _out_st[0x3f] = '\0';
        _out_st[0x20] = '\0';
        _out_st[0x21] = '\0';
        _out_st[0x22] = '\0';
        _out_st[0x23] = '\0';
        _out_st[0x24] = '\0';
        _out_st[0x25] = '\0';
        _out_st[0x26] = '\0';
        _out_st[0x27] = '\0';
        _out_st[0x28] = '\0';
        _out_st[0x29] = '\0';
        _out_st[0x2a] = '\0';
        _out_st[0x2b] = '\0';
        _out_st[0x2c] = '\0';
        _out_st[0x2d] = '\0';
        _out_st[0x2e] = '\0';
        _out_st[0x2f] = '\0';
        _out_st[0x10] = '\0';
        _out_st[0x11] = '\0';
        _out_st[0x12] = '\0';
        _out_st[0x13] = '\0';
        _out_st[0x14] = '\0';
        _out_st[0x15] = '\0';
        _out_st[0x16] = '\0';
        _out_st[0x17] = '\0';
        _out_st[0x18] = '\0';
        _out_st[0x19] = '\0';
        _out_st[0x1a] = '\0';
        _out_st[0x1b] = '\0';
        _out_st[0x1c] = '\0';
        _out_st[0x1d] = '\0';
        _out_st[0x1e] = '\0';
        _out_st[0x1f] = '\0';
        *(char **)_out_st = _out_st + 0x10;
        _out_st[8] = '\0';
        _out_st[9] = '\0';
        _out_st[10] = '\0';
        _out_st[0xb] = '\0';
        _out_st[0xc] = '\0';
        _out_st[0xd] = '\0';
        _out_st[0xe] = '\0';
        _out_st[0xf] = '\0';
        _out_st[0x50] = '\0';
        _out_st[0x51] = '\0';
        _out_st[0x52] = '\0';
        _out_st[0x53] = '\0';
        _out_st[0x54] = '\0';
        _out_st[0x55] = '\0';
        _out_st[0x56] = '\0';
        _out_st[0x57] = '\0';
        _out_st[0x40] = '\0';
        _out_st[0x41] = '\0';
        _out_st[0x42] = '\0';
        _out_st[0x43] = '\0';
        _out_st[0x44] = '\0';
        _out_st[0x45] = '\0';
        _out_st[0x46] = '\0';
        _out_st[0x47] = '\0';
        _out_st[0x48] = '\0';
        _out_st[0x49] = '\0';
        _out_st[0x4a] = '\0';
        _out_st[0x4b] = '\0';
        _out_st[0x4c] = '\0';
        _out_st[0x4d] = '\0';
        _out_st[0x4e] = '\0';
        _out_st[0x4f] = '\0';
        _out_st[0x80] = '\0';
        _out_st[0x81] = '\0';
        _out_st[0x82] = '\0';
        _out_st[0x83] = '\0';
        _out_st[0x84] = '\0';
        _out_st[0x85] = '\0';
        _out_st[0x86] = '\0';
        _out_st[0x87] = '\0';
        _out_st[0x70] = '\0';
        _out_st[0x71] = '\0';
        _out_st[0x72] = '\0';
        _out_st[0x73] = '\0';
        _out_st[0x74] = '\0';
        _out_st[0x75] = '\0';
        _out_st[0x76] = '\0';
        _out_st[0x77] = '\0';
        _out_st[0x78] = '\0';
        _out_st[0x79] = '\0';
        _out_st[0x7a] = '\0';
        _out_st[0x7b] = '\0';
        _out_st[0x7c] = '\0';
        _out_st[0x7d] = '\0';
        _out_st[0x7e] = '\0';
        _out_st[0x7f] = '\0';
        *(cgltf_mesh **)(_out_st + 0x20) = pcVar34;
        std::__cxx11::string::assign(_out_st);
        pcVar28 = _out_st;
        *(cgltf_primitive **)(_out_st + 0x28) = pcVar30;
        cVar27 = data_00->nodes_count;
        lVar29 = 0x28;
        while (bVar35 = cVar27 != 0, cVar27 = cVar27 - 1, bVar35) {
          lVar25 = *(long *)((long)data_00->nodes->translation + lVar29 + -0x68);
          if (((lVar25 != 0) &&
              (puVar2 = *(undefined8 **)((long)data_00->nodes->translation + lVar29 + -0x60),
              puVar2 != (undefined8 *)0x0)) &&
             ((pcVar3 = (char *)*puVar2, pcVar3 != (char *)0x0 &&
              (iVar17 = strcmp(pcVar3,pcVar34->name), iVar17 == 0)))) goto LAB_0010c952;
          lVar29 = lVar29 + 0xf0;
        }
        lVar25 = 0;
LAB_0010c952:
        *(long *)(pcVar28 + 0x38) = lVar25;
        pcVar33 = pcVar30->indices;
        *(cgltf_accessor **)(pcVar28 + 0x68) = pcVar33;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pcVar28 + 0x40),
                   pcVar33->count);
        pcVar33 = pcVar30->indices;
        cVar27 = pcVar33->count;
        for (index = 0; pcVar3 = _out_st, cVar27 != index; index = index + 1) {
          cVar19 = cgltf_accessor_read_index(pcVar33,index);
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(pcVar28 + 0x40))->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[index] = (uint)cVar19;
        }
        lVar29 = *(long *)(*(long *)(_out_st + 0x28) + 0x20);
        lVar25 = 0x10;
        pcVar33 = (cgltf_accessor *)0x0;
        while (bVar35 = lVar29 != 0, lVar29 = lVar29 + -1, bVar35) {
          lVar4 = *(long *)(*(long *)(_out_st + 0x28) + 0x18);
          if (*(int *)(lVar4 + -8 + lVar25) == 1) {
            pcVar33 = *(cgltf_accessor **)(lVar4 + lVar25);
          }
          lVar25 = lVar25 + 0x20;
        }
        if (pcVar33 != (cgltf_accessor *)0x0) {
          sVar31 = pcVar33->count * 3;
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)(_out_st + 0x70),sVar31);
          cgltf_accessor_unpack_floats(pcVar33,*(cgltf_float **)(pcVar3 + 0x70),sVar31);
          cVar27 = pcVar33->stride;
          *(cgltf_size *)(pcVar3 + 0x58) = pcVar33->count;
          *(cgltf_size *)(pcVar3 + 0x60) = cVar27;
        }
        std::vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::push_back
                  (&meshes,(value_type *)&out_st);
        uVar20 = local_c58._0_8_ + 1;
      }
      uVar20 = local_c68._0_8_ + 1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&inss_json);
    poVar21 = std::operator<<(local_1a8,local_c78);
    std::operator<<(poVar21,".in.json");
    write_options.file.release =
         (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
    write_options.file.user_data = (void *)0x0;
    write_options.memory.user_data = (void *)0x0;
    write_options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    write_options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    write_options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
    write_options.type = cgltf_file_type_invalid;
    write_options._4_4_ = 0;
    write_options.json_token_count = 0;
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,(char *)options._0_8_,data_00);
    std::__cxx11::string::~string((string *)&options);
    local_c40 = (double)local_c40._0_4_;
    uVar36 = extraout_XMM0_Dc;
    uVar37 = extraout_XMM0_Dd;
    for (uVar20 = 0;
        uVar20 < (ulong)((long)meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      pMVar5 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
      sVar31 = (long)(pMVar5->indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pMVar5->indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      dVar11 = (double)(sVar31 / 3) * local_c40;
      local_c58._8_4_ = uVar36;
      local_c58._0_8_ = dVar11;
      local_c58._12_4_ = uVar37;
      local_c68._8_4_ = uVar36;
      local_c68._0_8_ = dVar11 - 9.223372036854776e+18;
      local_c68._12_4_ = uVar37;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar31,
                 (allocator_type *)&data);
      target_index_count =
           ((long)(double)local_c68._0_8_ & (long)(double)local_c58._0_8_ >> 0x3f |
           (long)(double)local_c58._0_8_) * 3;
      puVar6 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar22 = meshopt_simplify((uint *)options._0_8_,puVar6,
                                (long)(pMVar5->indices).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2
                                ,(pMVar5->positions).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start,pMVar5->vertex_count,
                                pMVar5->vertex_positions_stride,target_index_count,0.01,(float *)0x0
                               );
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar22);
      uVar14 = options._0_8_;
      puVar6 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)options._0_8_;
      puVar8 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      p_Var7 = (_func_void_ptr_void_ptr_cgltf_size *)
               (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
      (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
      options.memory.alloc = p_Var7;
      if ((((ulong)local_c38 & 1) != 0) &&
         (sVar22 = (long)(options.json_token_count - options._0_8_) >> 2,
         target_index_count < sVar22)) {
        options._0_8_ = puVar6;
        options.json_token_count = (cgltf_size)puVar8;
        sVar22 = meshopt_simplifySloppy
                           (puVar6,(uint *)uVar14,sVar22,
                            (pMVar5->positions).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start,pMVar5->vertex_count,
                            pMVar5->vertex_positions_stride,target_index_count,0.1,(float *)0x0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar22);
        p_Var7 = (_func_void_ptr_void_ptr_cgltf_size *)
                 (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
        puVar6 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar8 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)options._0_8_;
        (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
        options.memory.alloc = p_Var7;
      }
      options.json_token_count = (cgltf_size)puVar8;
      options._0_8_ = puVar6;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&options);
      uVar36 = extraout_XMM0_Dc_00;
      uVar37 = extraout_XMM0_Dd_00;
    }
    std::vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::vector
              ((vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> *)&local_c10,&meshes);
    options.memory.free = (_func_void_void_ptr_void_ptr *)&options.json_token_count;
    options.json_token_count = options.json_token_count & 0xffffffff00000000;
    options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    options.memory.user_data = options.memory.free;
    for (; p_Var24 = (_Rb_tree_node_base *)options.memory.free,
        local_c10._M_impl.super__Vector_impl_data._M_start !=
        local_c10._M_impl.super__Vector_impl_data._M_finish;
        local_c10._M_impl.super__Vector_impl_data._M_start =
             local_c10._M_impl.super__Vector_impl_data._M_start + 1) {
      pMVar5 = *local_c10._M_impl.super__Vector_impl_data._M_start;
      pcVar33 = pMVar5->indices_accessor;
      puVar8 = (pMVar5->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar26 = (long)(pMVar5->indices).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar8;
      pcVar33->count = (long)sVar26 >> 2;
      pcVar9 = pcVar33->buffer_view;
      pcVar9->size = sVar26;
      memcpy((void *)((long)pcVar9->buffer->data + pcVar9->offset),puVar8,sVar26);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&options,&pMVar5->indices_accessor->buffer_view->buffer_index);
    }
    while (p_Var24 != (_Rb_tree_node_base *)&options.json_token_count) {
      lVar29 = *(long *)(p_Var24 + 1);
      local_c68._0_8_ = data_00->buffers + lVar29;
      local_c38 = p_Var24;
      pvVar23 = malloc(data_00->buffers[lVar29].size);
      local_c58._0_8_ = pvVar23;
      cVar27 = data_00->buffer_views_count;
      lVar25 = 8;
      sVar26 = 0;
      while( true ) {
        bVar35 = cVar27 == 0;
        cVar27 = cVar27 - 1;
        uVar14 = local_c58._0_8_;
        if (bVar35) break;
        pcVar9 = data_00->buffer_views;
        if (*(long *)((long)&pcVar9->extensions + lVar25) == lVar29) {
          __n = *(size_t *)((long)&pcVar9->offset + lVar25);
          memcpy((void *)(local_c58._0_8_ + sVar26),
                 (void *)(*(size_t *)(local_c68._0_8_ + 0x10) +
                         *(long *)((long)&pcVar9->buffer + lVar25)),__n);
          *(size_t *)((long)&pcVar9->buffer + lVar25) = sVar26;
          sVar26 = sVar26 + (__n + 3 & 0xfffffffffffffffc);
        }
        lVar25 = lVar25 + 0x90;
      }
      *(size_t *)local_c68._0_8_ = sVar26;
      memcpy(*(void **)(local_c68._0_8_ + 0x10),(void *)local_c58._0_8_,sVar26);
      free((void *)uVar14);
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_c38);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&options);
    std::_Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::~_Vector_base(&local_c10);
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_json);
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_bin);
    poVar21 = std::operator<<(local_330,local_c78);
    std::operator<<(poVar21,".json");
    poVar21 = std::operator<<(local_4b8,local_c78);
    std::operator<<(poVar21,".bin");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,out_json._M_dataplus._M_p,data_00);
    std::__cxx11::string::string((string *)local_b38,(string *)&out_bin);
    std::ofstream::ofstream(&options);
    std::ofstream::open((char *)&options,local_b38[0]);
    lVar29 = 0;
    for (uVar20 = 0; uVar20 < data_00->buffers_count; uVar20 = uVar20 + 1) {
      pcVar10 = data_00->buffers;
      std::ostream::write((char *)&options,(long)&pcVar10->size + lVar29);
      std::ostream::write((char *)&options,0x11c1f4);
      std::ostream::write((char *)&options,*(long *)((long)&pcVar10->data + lVar29));
      lVar29 = lVar29 + 0x38;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&options);
    std::__cxx11::string::~string((string *)local_b38);
    std::__cxx11::string::string(local_b58,local_c78,&local_c69);
    std::__cxx11::string::string(local_b78,(string *)&out_json);
    std::__cxx11::string::string(local_b98,(string *)&out_bin);
    std::ifstream::ifstream(&options,local_b78,_S_bin);
    std::ifstream::ifstream(&data,local_b98,_S_bin);
    std::ofstream::ofstream(&out_st,local_b58,_S_trunc|_S_bin);
    std::istream::seekg((long)&options,_S_beg);
    uVar18 = std::istream::tellg();
    json_size = uVar18;
    std::istream::seekg((long)&options,_S_beg);
    std::istream::seekg((long)&data,_S_beg);
    iVar17 = std::istream::tellg();
    std::istream::seekg((long)&data,_S_beg);
    local_c30 = uVar18 + iVar17 + 0x14;
    std::ostream::write((char *)&out_st,0x11c1f8);
    std::ostream::write((char *)&out_st,0x11c1fc);
    std::ostream::write((char *)&out_st,(long)&local_c30);
    std::ostream::write((char *)&out_st,(long)&json_size);
    std::ostream::write((char *)&out_st,0x11c200);
    std::ostream::operator<<((ostream *)&out_st,(streambuf *)&options.memory);
    std::ostream::operator<<((ostream *)&out_st,local_6c0);
    std::ofstream::close();
    std::ofstream::~ofstream(&out_st);
    std::ifstream::~ifstream(&data);
    std::ifstream::~ifstream(&options);
    std::__cxx11::string::~string(local_b98);
    std::__cxx11::string::~string(local_b78);
    std::__cxx11::string::~string(local_b58);
    for (uVar20 = 0;
        uVar20 < (ulong)((long)meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1)
    {
      pMVar5 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
      if (pMVar5 != (Mesh *)0x0) {
        VRM::Mesh::~Mesh(pMVar5);
      }
      operator_delete(pMVar5);
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    cgltf_free(data_00);
    std::__cxx11::string::~string((string *)&out_bin);
    std::__cxx11::string::~string((string *)&out_json);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_bin);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_json);
    std::__cxx11::stringstream::~stringstream((stringstream *)&inss_json);
    iVar17 = 0;
  }
  else {
    pcVar28 = "Failed to parse file %s\n";
LAB_0010d33b:
    fprintf(_stderr,pcVar28,local_c68._0_8_);
    iVar17 = 4;
  }
  std::_Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::~_Vector_base
            (&meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>);
LAB_0010d1c4:
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&testinputs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return iVar17;
}

Assistant:

int main(int argc, char** argv)
{
	Settings settings = defaults();

	const char* input = 0;
	const char* output = 0;
	bool help = false;

	std::vector<const char*> testinputs;

	for (int i = 1; i < argc; ++i)
	{
		const char* arg = argv[i];

		if (strcmp(arg, "-si") == 0 && i + 1 < argc && isdigit(argv[i + 1][0]))
		{
			settings.simplify_threshold = float(atof(argv[++i]));
		}
		else if (strcmp(arg, "-sa") == 0)
		{
			settings.simplify_aggressive = true;
		}
		else if (strcmp(arg, "-i") == 0 && i + 1 < argc && !input)
		{
			input = argv[++i];
		}
		else if (strcmp(arg, "-o") == 0 && i + 1 < argc && !output)
		{
			output = argv[++i];
		}
		else if (strcmp(arg, "-v") == 0)
		{
			settings.verbose = 1;
		}
		else if (strcmp(arg, "-vv") == 0)
		{
			settings.verbose = 2;
		}
		else if (strcmp(arg, "-h") == 0)
		{
			help = true;
		}
		else if (arg[0] == '-')
		{
			fprintf(stderr, "Unrecognized option %s\n", arg);
			return 1;
		}
	}

	// shortcut for vrmpack -v
	if (settings.verbose && argc == 2)
	{
		printf("vrmpack %s\n", getVersion().c_str());
		return 0;
	}

	if (!input || !output || help)
	{
		fprintf(stderr, "vrmpack %s\n", getVersion().c_str());
		fprintf(stderr, "Usage: vrmpack [options] -i input -o output\n");

		if (help)
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\nSimplification:\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\t-sa: aggressively simplify to the target ratio disregarding quality\n");
			fprintf(stderr, "\nMiscellaneous:\n");
			fprintf(stderr, "\t-v: verbose output (print version when used without other options)\n");
			fprintf(stderr, "\t-h: display this help and exit\n");
		}
		else
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\nRun vrmpack -h to display a full list of options\n");
		}

		return 1;
	}

	return vrmpack(input, output, settings);
}